

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O2

void __thiscall libtorrent::peer_connection::keep_alive(peer_connection *this)

{
  long lVar1;
  int iVar2;
  time_point tVar3;
  
  tVar3 = aux::time_now();
  lVar1 = (this->m_last_sent).__d.__r;
  iVar2 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x33])(this);
  if (((long)(iVar2 / 2) <= ((long)tVar3.__d.__r - lVar1) / 1000000000) &&
     (((this->super_peer_connection_hot_members).field_0x28 & 2) == 0)) {
    iVar2 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x1b])(this);
    if (((char)iVar2 == '\0') && ((this->m_channel_state[0].m_val & 4) == 0)) {
      peer_log(this,outgoing_message,"KEEPALIVE");
      (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x27])(this);
      return;
    }
  }
  return;
}

Assistant:

void peer_connection::keep_alive()
	{
		TORRENT_ASSERT(is_single_thread());
#ifdef TORRENT_EXPENSIVE_INVARIANT_CHECKS
		INVARIANT_CHECK;
#endif

		time_duration const d = aux::time_now() - m_last_sent;
		if (total_seconds(d) < timeout() / 2) return;

		if (m_connecting) return;
		if (in_handshake()) return;

		// if the last send has not completed yet, do not send a keep
		// alive
		if (m_channel_state[upload_channel] & peer_info::bw_network) return;

#ifndef TORRENT_DISABLE_LOGGING
		peer_log(peer_log_alert::outgoing_message, "KEEPALIVE");
#endif

		write_keepalive();
	}